

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

int __thiscall
QTableViewPrivate::heightHintForIndex
          (QTableViewPrivate *this,QModelIndex *index,int hint,QStyleOptionViewItem *option)

{
  Representation *pRVar1;
  int x;
  Data *pDVar2;
  Data *this_00;
  int iVar3;
  QEditorInfo *pQVar4;
  Node<QWidget_*,_QHashDummyValue> *pNVar5;
  int extraout_var;
  QSize QVar6;
  QSize QVar7;
  Span *span;
  long *plVar8;
  int extraout_var_00;
  int iVar9;
  long in_FS_OFFSET;
  QRect QVar10;
  QWidget *editor;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar8 = *(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                      super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar4 = QAbstractItemViewPrivate::editorForIndex(&this->super_QAbstractItemViewPrivate,index);
  pDVar2 = (pQVar4->widget).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    local_40 = (QWidget *)0x0;
  }
  else {
    local_40 = (QWidget *)(pQVar4->widget).wp.value;
  }
  if ((local_40 != (QWidget *)0x0) &&
     (this_00 = (this->super_QAbstractItemViewPrivate).persistent.q_hash.d, this_00 != (Data *)0x0))
  {
    pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QWidget*,QHashDummyValue>>::findNode<QWidget*>
                       ((Data<QHashPrivate::Node<QWidget*,QHashDummyValue>> *)this_00,&local_40);
    if (pNVar5 != (Node<QWidget_*,_QHashDummyValue> *)0x0) {
      (**(code **)(*(long *)local_40 + 0x70))();
      if (hint < extraout_var) {
        hint = extraout_var;
      }
      QVar6 = QWidget::minimumSize(local_40);
      QVar7 = QWidget::maximumSize(local_40);
      if (QVar7.ht.m_i.m_i <= hint) {
        hint = QVar7.ht.m_i.m_i;
      }
      if (hint <= QVar6.ht.m_i.m_i) {
        hint = QVar6.ht.m_i.m_i;
      }
    }
  }
  if ((this->super_QAbstractItemViewPrivate).wrapItemText == true) {
    iVar3 = QHeaderView::sectionViewportPosition(*(QHeaderView **)(plVar8[1] + 0x588),index->r);
    (option->super_QStyleOption).rect.y1.m_i = iVar3;
    iVar3 = QHeaderView::sectionSize(*(QHeaderView **)(plVar8[1] + 0x588),index->r);
    (option->super_QStyleOption).rect.y2.m_i =
         iVar3 + (option->super_QStyleOption).rect.y1.m_i + (uint)(iVar3 == 0) + -1;
    iVar3 = QHeaderView::sectionViewportPosition(*(QHeaderView **)(plVar8[1] + 0x580),index->c);
    (option->super_QStyleOption).rect.x1.m_i = iVar3;
    iVar3 = QHeaderView::sectionSize(*(QHeaderView **)(plVar8[1] + 0x580),index->c);
    (option->super_QStyleOption).rect.x2.m_i = iVar3 + (option->super_QStyleOption).rect.x1.m_i + -1
    ;
    if ((QSpanCollection *)
        (this->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != &this->spans) {
      iVar9 = index->r;
      x = index->c;
      span = QSpanCollection::spanAt(&this->spans,x,iVar9);
      if (((span != (Span *)0x0) && (span->m_left == x)) && (span->m_top == iVar9)) {
        QVar10 = visualSpanRect(this,span);
        iVar9 = (QVar10.x2.m_i.m_i - QVar10.x1.m_i) + 1;
        if (iVar9 < iVar3) {
          iVar9 = iVar3;
        }
        (option->super_QStyleOption).rect.x2.m_i =
             (option->super_QStyleOption).rect.x1.m_i + iVar9 + -1;
      }
    }
    if (this->showGrid == true) {
      pRVar1 = &(option->super_QStyleOption).rect.x2;
      pRVar1->m_i = pRVar1->m_i + -1;
    }
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x208))(plVar8,index);
  (**(code **)(*plVar8 + 0x68))(plVar8,option,index);
  iVar3 = extraout_var_00;
  if (extraout_var_00 < hint) {
    iVar3 = hint;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QTableViewPrivate::heightHintForIndex(const QModelIndex &index, int hint, QStyleOptionViewItem &option) const
{
    Q_Q(const QTableView);
    QWidget *editor = editorForIndex(index).widget.data();
    if (editor && persistent.contains(editor)) {
        hint = qMax(hint, editor->sizeHint().height());
        int min = editor->minimumSize().height();
        int max = editor->maximumSize().height();
        hint = qBound(min, hint, max);
    }

    if (wrapItemText) {// for wrapping boundaries
        option.rect.setY(q->rowViewportPosition(index.row()));
        int height = q->rowHeight(index.row());
        // if the option.height == 0 then q->itemDelegateForIndex(index)->sizeHint(option, index) will be wrong.
        // The option.height == 0 is used to conclude that the text is not wrapped, and hence it will
        // (exactly like widthHintForIndex) return a QSize with a long width (that we don't use) -
        // and the height of the text if it was/is on one line.
        // What we want is a height hint for the current width (and we know that this section is not hidden)
        // Therefore we catch this special situation with:
        if (height == 0)
            height = 1;
        option.rect.setHeight(height);
        option.rect.setX(q->columnViewportPosition(index.column()));
        option.rect.setWidth(q->columnWidth(index.column()));
        if (hasSpans()) {
            auto span = spans.spanAt(index.column(), index.row());
            if (span && span->m_left == index.column() && span->m_top == index.row())
                option.rect.setWidth(std::max(option.rect.width(), visualSpanRect(*span).width()));
        }
        // 1px less space when grid is shown (see drawCell)
        if (showGrid)
            option.rect.setWidth(option.rect.width() - 1);
    }
    hint = qMax(hint, q->itemDelegateForIndex(index)->sizeHint(option, index).height());
    return hint;
}